

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

void __thiscall CVmDynamicFunc::save_to_file(CVmDynamicFunc *this,CVmFile *fp)

{
  vm_val_t *val;
  int i;
  long lVar1;
  char buf [5];
  
  val = (vm_val_t *)(this->super_CVmObject).ext_;
  CVmFile::write_uint2(fp,val[2].typ);
  CVmFile::write_uint2(fp,val[2].val.obj);
  vmb_put_dh(buf,val + 1);
  CVmFile::write_bytes(fp,buf,5);
  vmb_put_dh(buf,val);
  CVmFile::write_bytes(fp,buf,5);
  CVmFile::write_bytes(fp,(char *)(&val[3].typ + val[2].val.intval),*(size_t *)(val + 2));
  for (lVar1 = 0; lVar1 < val[2].val.intval; lVar1 = lVar1 + 1) {
    CVmFile::write_uint2(fp,*(uint *)((long)&val[2].val + lVar1 * 4 + 4));
  }
  return;
}

Assistant:

void CVmDynamicFunc::save_to_file(VMG_ class CVmFile *fp)
{
    char buf[VMB_DATAHOLDER];
    vm_dynfunc_ext *ext = get_ext();

    /* write our source code length */
    fp->write_uint2(ext->bytecode_len);

    /* write our object reference count */
    fp->write_uint2(ext->obj_ref_cnt);

    /* write the method context object */
    vmb_put_dh(buf, &ext->method_ctx);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* write our source object value */
    vmb_put_dh(buf, &ext->src);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* write the bytecode data */
    fp->write_bytes(ext->get_bytecode_ptr(), ext->bytecode_len);

    /* write the object reference list */
    for (int i = 0 ; i < ext->obj_ref_cnt ; ++i)
        fp->write_uint2(ext->obj_refs[i]);
}